

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

adj_list *
get_adj(adj_list *__return_storage_ptr__,int nv,vector<Arc,_std::allocator<Arc>_> *arcs,
       bool transpose)

{
  vector<Arc,_std::allocator<Arc>_> *this;
  bool bVar1;
  runtime_error *this_00;
  reference pvVar2;
  pair<int,_int> local_168;
  pair<int,_int> local_160;
  char local_158 [8];
  char _error_msg_ [256];
  Arc *a;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Arc,_std::allocator<Arc>_> *__range1;
  allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_23;
  undefined1 local_22;
  byte local_21;
  vector<Arc,_std::allocator<Arc>_> *pvStack_20;
  bool transpose_local;
  vector<Arc,_std::allocator<Arc>_> *arcs_local;
  adj_list *paStack_10;
  int nv_local;
  adj_list *adj;
  
  local_22 = 0;
  local_21 = transpose;
  pvStack_20 = arcs;
  arcs_local._4_4_ = nv;
  paStack_10 = __return_storage_ptr__;
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  allocator(&local_23);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(__return_storage_ptr__,(long)nv,&local_23);
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  ~allocator(&local_23);
  this = pvStack_20;
  __end1 = std::vector<Arc,_std::allocator<Arc>_>::begin(pvStack_20);
  a = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>
                                *)&a);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    _error_msg_._248_8_ =
         __gnu_cxx::__normal_iterator<const_Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::
         operator*(&__end1);
    if ((arcs_local._4_4_ <= ((reference)_error_msg_._248_8_)->u) ||
       (arcs_local._4_4_ <= ((reference)_error_msg_._248_8_)->v)) break;
    if ((local_21 & 1) == 0) {
      pvVar2 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[](__return_storage_ptr__,(long)((reference)_error_msg_._248_8_)->u);
      local_160 = std::make_pair<int_const&,int_const&>
                            ((int *)(_error_msg_._248_8_ + 4),(int *)(_error_msg_._248_8_ + 8));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (pvVar2,&local_160);
    }
    else {
      pvVar2 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[](__return_storage_ptr__,(long)((reference)_error_msg_._248_8_)->v);
      local_168 = std::make_pair<int_const&,int_const&>
                            ((int *)_error_msg_._248_8_,(int *)(_error_msg_._248_8_ + 8));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (pvVar2,&local_168);
    }
    __gnu_cxx::__normal_iterator<const_Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator++
              (&__end1);
  }
  snprintf(local_158,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "a.u < nv && a.v < nv",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/graph.cpp",
           0x49);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_158);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

adj_list get_adj(int nv, const std::vector<Arc> &arcs, bool transpose) {
	adj_list adj(nv);
	for (const Arc &a : arcs) {
		throw_assert(a.u < nv && a.v < nv);
		if (!transpose) {
			adj[a.u].push_back(MP(a.v, a.label));
		} else {
			adj[a.v].push_back(MP(a.u, a.label));
		}
	}
	return adj;
}